

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

void __thiscall amrex::MLMG::prepareForNSolve(MLMG *this)

{
  CFStrategy CVar1;
  MLLinOp *pMVar2;
  BoxArray *bxs;
  DistributionMapping *dm;
  FabFactory<amrex::FArrayBox> *pFVar3;
  FabArray<amrex::FArrayBox> *pFVar4;
  undefined8 uVar5;
  int ncomp;
  MultiFab *pMVar6;
  MultiFab *pMVar7;
  MLMG *pMVar8;
  pointer __p;
  int iVar9;
  int local_60;
  MFInfo local_58;
  
  (*this->linop->_vptr_MLLinOp[0x21])
            ((_Head_base<0UL,_amrex::MLLinOp_*,_false> *)&local_58,this->linop,
             (ulong)(uint)this->nsolve_grid_size);
  uVar5 = local_58._0_8_;
  local_58._0_8_ = (MLLinOp *)0x0;
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  (this->ns_linop)._M_t.super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
  super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl = (MLLinOp *)uVar5;
  if ((pMVar2 != (MLLinOp *)0x0) &&
     ((*pMVar2->_vptr_MLLinOp[1])(), (MLLinOp *)local_58._0_8_ != (MLLinOp *)0x0)) {
    (**(code **)(*(long *)local_58._0_8_ + 8))();
  }
  ncomp = (*this->linop->_vptr_MLLinOp[5])();
  if (this->cf_strategy == ghostnodes) {
    local_60 = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,0);
    iVar9 = 1;
    if (this->cf_strategy == ghostnodes) {
      iVar9 = local_60;
    }
  }
  else {
    local_60 = 0;
    iVar9 = 1;
  }
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  bxs = (BoxArray *)
        **(undefined8 **)
          &(pMVar2->m_grids).
           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ;
  dm = (DistributionMapping *)
       **(undefined8 **)
         &(pMVar2->m_dmap).
          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
          .
          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ;
  local_58._0_8_ = (MLLinOp *)0x1;
  local_58.arena = (Arena *)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3 = *(FabFactory<amrex::FArrayBox> **)
            **(undefined8 **)
              &(pMVar2->m_factory).
               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ;
  pMVar6 = (MultiFab *)operator_new(0x180);
  MultiFab::MultiFab(pMVar6,bxs,dm,ncomp,iVar9,&local_58,pFVar3);
  pMVar7 = (this->ns_sol)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->ns_sol)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar6;
  if (pMVar7 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58.tags);
  CVar1 = this->cf_strategy;
  local_58._0_8_ = (MLLinOp *)0x1;
  local_58.arena = (Arena *)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3 = *(FabFactory<amrex::FArrayBox> **)
            **(undefined8 **)
              &(((this->ns_linop)._M_t.
                 super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
                 super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl)->m_factory).
               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ;
  pMVar7 = (MultiFab *)operator_new(0x180);
  iVar9 = 0;
  if (CVar1 == ghostnodes) {
    iVar9 = local_60;
  }
  MultiFab::MultiFab(pMVar7,bxs,dm,ncomp,iVar9,&local_58,pFVar3);
  pMVar6 = (this->ns_rhs)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->ns_rhs)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar7;
  if (pMVar6 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58.tags);
  pFVar4 = &((this->ns_sol)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
            super_FabArray<amrex::FArrayBox>;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (pFVar4,0.0,0,(pFVar4->super_FabArrayBase).n_comp,&(pFVar4->super_FabArrayBase).n_grow);
  pFVar4 = &((this->ns_rhs)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
            super_FabArray<amrex::FArrayBox>;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (pFVar4,0.0,0,(pFVar4->super_FabArrayBase).n_comp,&(pFVar4->super_FabArrayBase).n_grow);
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  (*pMVar2->_vptr_MLLinOp[3])
            (pMVar2,0,(this->ns_sol)._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,0);
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  pMVar8 = (MLMG *)operator_new(0x198);
  MLMG(pMVar8,pMVar2);
  local_58._0_8_ = (MLLinOp *)0x0;
  std::__uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::reset
            ((__uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)&this->ns_mlmg,
             pMVar8);
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::~unique_ptr
            ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)&local_58);
  pMVar8 = (this->ns_mlmg)._M_t.
           super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
           super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl;
  pMVar8->verbose = 0;
  pMVar8->do_fixed_number_of_iters = 1;
  pMVar8->max_fmg_iters = 0x14;
  pMVar8->bottom_solver = smoother;
  return;
}

Assistant:

void
MLMG::prepareForNSolve ()
{
    ns_linop = linop.makeNLinOp(nsolve_grid_size);

    const int ncomp = linop.getNComp();
    int nghost = 0;
    if (cf_strategy == CFStrategy::ghostnodes) nghost = linop.getNGrow();

    const BoxArray& ba = (*ns_linop).m_grids[0][0];
    const DistributionMapping& dm =(*ns_linop).m_dmap[0][0];

    int ng = 1;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_sol = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ng = 0;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_rhs = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ns_sol->setVal(0.0);
    ns_rhs->setVal(0.0);

    ns_linop->setLevelBC(0, ns_sol.get());

    ns_mlmg = std::make_unique<MLMG>(*ns_linop);
    ns_mlmg->setVerbose(0);
    ns_mlmg->setFixedIter(1);
    ns_mlmg->setMaxFmgIter(20);
    ns_mlmg->setBottomSolver(BottomSolver::smoother);
}